

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O3

bool __thiscall
ON_Viewport::GetFrustumLine(ON_Viewport *this,double screenx,double screeny,ON_Line *world_line)

{
  bool bVar1;
  ON_Line line;
  ON_Xform s2c;
  ON_Xform c2w;
  ON_Line local_1a8;
  ON_3dPoint local_170;
  double local_158;
  double local_148;
  ON_3dPoint local_138;
  ON_Xform local_118;
  ON_Xform local_98;
  
  local_158 = screeny;
  local_148 = screenx;
  ON_Xform::ON_Xform(&local_118);
  ON_Xform::ON_Xform(&local_98);
  ON_Line::ON_Line(&local_1a8);
  bVar1 = GetXform(this,screen_cs,clip_cs,&local_118);
  if (bVar1) {
    bVar1 = GetXform(this,clip_cs,world_cs,&local_98);
    if (bVar1) {
      local_138.x = local_118.m_xform[0][3] +
                    local_148 * local_118.m_xform[0][0] + local_158 * local_118.m_xform[0][1];
      local_138.y = local_118.m_xform[1][3] +
                    local_148 * local_118.m_xform[1][0] + local_158 * local_118.m_xform[1][1];
      local_138.z = 1.0;
      ON_Xform::operator*(&local_170,&local_98,&local_138);
      local_1a8.to.z = local_170.z;
      local_1a8.to.x = local_170.x;
      local_1a8.to.y = local_170.y;
      local_138.z = -1.0;
      ON_Xform::operator*(&local_170,&local_98,&local_138);
      local_1a8.from.z = local_170.z;
      local_1a8.from.x = local_170.x;
      local_1a8.from.y = local_170.y;
      (world_line->to).y = local_1a8.to.y;
      (world_line->to).z = local_1a8.to.z;
      (world_line->from).z = local_170.z;
      (world_line->to).x = local_1a8.to.x;
      (world_line->from).x = local_170.x;
      (world_line->from).y = local_170.y;
      bVar1 = true;
      goto LAB_0066aa40;
    }
  }
  bVar1 = false;
LAB_0066aa40:
  ON_Line::~ON_Line(&local_1a8);
  return bVar1;
}

Assistant:

bool ON_Viewport::GetFrustumLine( double screenx, double screeny, ON_Line& world_line ) const
{
  ON_Xform s2c, c2w;
  ON_3dPoint c;
  ON_Line line;
  bool rc;

  rc = GetXform( ON::screen_cs, ON::clip_cs, s2c );
  if ( rc )
    rc = GetXform( ON::clip_cs, ON::world_cs, c2w );
  if (rc )
  {
    // c = mouse point on near clipping plane
    c.x = s2c.m_xform[0][0]*screenx + s2c.m_xform[0][1]*screeny + s2c.m_xform[0][3];
    c.y = s2c.m_xform[1][0]*screenx + s2c.m_xform[1][1]*screeny + s2c.m_xform[1][3];
    c.z = 1.0;
    line.to = c2w*c;   // line.to = near plane mouse point in world coords
    c.z = -1.0;
    line.from = c2w*c; // line.from = far plane mouse point in world coords

    world_line = line;
  }
  return rc;
}